

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.hpp
# Opt level: O0

void __thiscall
glu::decl::DeclareVariable::DeclareVariable
          (DeclareVariable *this,VarType *varType_,string *name_,int indentLevel_)

{
  int indentLevel__local;
  string *name__local;
  VarType *varType__local;
  DeclareVariable *this_local;
  
  VarType::VarType(&this->varType,varType_);
  std::__cxx11::string::string((string *)&this->name,(string *)name_);
  this->indentLevel = indentLevel_;
  return;
}

Assistant:

DeclareVariable (const VarType& varType_, const std::string& name_, int indentLevel_) : varType(varType_), name(name_), indentLevel(indentLevel_) {}